

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall Buffer::DeleteFile(Buffer *this,string *filename)

{
  size_t *psVar1;
  char *__n;
  _List_node_base *p_Var2;
  int iVar3;
  int iVar4;
  _List_node_base *p_Var5;
  ostream *poVar6;
  Block *pBVar7;
  
  p_Var5 = (this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
           super__List_node_base._M_next;
  while (p_Var5 != (_List_node_base *)&this->Occupy_Block) {
    iVar4 = *(int *)&p_Var5[1]._M_next;
    __n = (char *)this->buffer[iVar4].FileName._M_string_length;
    if ((__n == (char *)filename->_M_string_length) &&
       ((pBVar7 = this->buffer + iVar4, __n == (char *)0x0 ||
        (iVar3 = bcmp((pBVar7->FileName)._M_dataplus._M_p,(filename->_M_dataplus)._M_p,(size_t)__n),
        iVar3 == 0)))) {
      std::__cxx11::string::_M_replace((ulong)pBVar7,0,__n,0x1493a5);
      pBVar7->FileOff = -1;
      memset(pBVar7->data,0,0x2000);
      this->Dirty[iVar4] = 0;
      this->Pin[iVar4] = 0;
      p_Var2 = p_Var5->_M_next;
      psVar1 = &(this->Occupy_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var5,0x18);
      p_Var5 = (_List_node_base *)operator_new(0x18);
      *(int *)&p_Var5[1]._M_next = iVar4;
      std::__detail::_List_node_base::_M_hook(p_Var5);
      psVar1 = &(this->Empty_Block).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var5 = p_Var2;
    }
    else {
      p_Var5 = p_Var5->_M_next;
    }
  }
  iVar4 = remove((filename->_M_dataplus)._M_p);
  if (iVar4 != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Delete file ");
    poVar6 = std::operator<<(poVar6,(string *)filename);
    poVar6 = std::operator<<(poVar6," failed!");
    std::endl<char,std::char_traits<char>>(poVar6);
    system("pause");
    exit(1);
  }
  return;
}

Assistant:

void Buffer::DeleteFile(string filename) {
	int pos;
	list<int>::iterator it;
 	for (it = this->Occupy_Block.begin(); it != this->Occupy_Block.end();) {
		if (this->buffer[*it].FileName == filename) {
			pos = *it;
			this->buffer[pos].BlockClear();				//�����ļ���buffer�еĿ�ȫ�����
			this->UnDirt(pos);
			this->UnLock(pos);
			it = this->Occupy_Block.erase(it);
			this->Empty_Block.push_back(pos);
		}
		else {
			it++;
		}
	}
	if (remove(filename.c_str()) != 0) {
		cout << "Delete file " << filename << " failed!" << endl;
		system("pause");
		exit(1);
	}
}